

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::ExportSwiftObjectCompileCommand
          (cmNinjaTargetGenerator *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *moduleSourceFiles,
          string *moduleObjectFilename,string *flags,string *defines,string *includes,
          string *outputConfig,bool singleOutput)

{
  cmGeneratorTarget *this_00;
  pointer ppcVar1;
  cmMakefile *this_01;
  cmSourceFile *source;
  pointer pbVar2;
  bool bVar3;
  string *psVar4;
  cmGlobalNinjaGenerator *pcVar5;
  string *cmd;
  pointer s;
  pointer ppcVar6;
  string_view source_00;
  string_view separator;
  cmRulePlaceholderExpander *local_2b0;
  string sourceFilename;
  cmList compileCmds;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  string local_248;
  string escapedSourceFilenames;
  string commandLine;
  string objectFilename;
  string local_1c8;
  string escapedModuleObjectFilename;
  RuleVariables compileObjectVars;
  
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&compileObjectVars,"EXPORT_COMPILE_COMMANDS",
             (allocator<char> *)&escapedSourceFilenames);
  bVar3 = cmGeneratorTarget::GetPropertyAsBool(this_00,(string *)&compileObjectVars);
  std::__cxx11::string::~string((string *)&compileObjectVars);
  if (bVar3) {
    psVar4 = ConvertToNinjaPath(this,moduleObjectFilename);
    std::__cxx11::string::string((string *)&escapedModuleObjectFilename,(string *)psVar4);
    memset(&compileObjectVars,0,0x158);
    compileObjectVars.Language = "Swift";
    compileObjectVars.Flags = (flags->_M_dataplus)._M_p;
    compileObjectVars.Defines = (defines->_M_dataplus)._M_p;
    compileObjectVars.Includes = (includes->_M_dataplus)._M_p;
    filenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    filenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    filenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&filenames,
              (long)(moduleSourceFiles->
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>)
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(moduleSourceFiles->
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>)
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    ppcVar1 = (moduleSourceFiles->
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar6 = (moduleSourceFiles->
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
                   _M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar1;
        ppcVar6 = ppcVar6 + 1) {
      GetCompiledSourceNinjaPath_abi_cxx11_(&local_1c8,this,*ppcVar6);
      bVar3 = cmsys::SystemTools::FileIsFullPath(&local_1c8);
      if (!bVar3) {
        pcVar5 = GetGlobalGenerator(this);
        psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_
                           ((pcVar5->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                            CMakeInstance);
        cmsys::SystemTools::CollapseFullPath(&escapedSourceFilenames,&local_1c8,psVar4);
        std::__cxx11::string::operator=((string *)&local_1c8,(string *)&escapedSourceFilenames);
        std::__cxx11::string::~string((string *)&escapedSourceFilenames);
      }
      source_00._M_str = local_1c8._M_dataplus._M_p;
      source_00._M_len = local_1c8._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&sourceFilename,(cmOutputConverter *)this->LocalGenerator,source_00,SHELL,false);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filenames,
                 &sourceFilename);
      std::__cxx11::string::~string((string *)&sourceFilename);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    separator._M_str = " ";
    separator._M_len = 1;
    cmJoin(&escapedSourceFilenames,&filenames,separator,(string_view)ZEXT816(0));
    compileObjectVars.Source = escapedSourceFilenames._M_dataplus._M_p;
    this_01 = (this->super_cmCommonTargetGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sourceFilename,"CMAKE_Swift_COMPILE_OBJECT",
               (allocator<char> *)&objectFilename);
    psVar4 = cmMakefile::GetRequiredDefinition(this_01,&sourceFilename);
    std::__cxx11::string::~string((string *)&sourceFilename);
    cmList::cmList(&compileCmds,psVar4,Yes,No);
    (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
      super_cmOutputConverter._vptr_cmOutputConverter[6])(&local_2b0);
    ppcVar1 = (moduleSourceFiles->
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar6 = (moduleSourceFiles->
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
                   _M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar1;
        ppcVar6 = ppcVar6 + 1) {
      source = *ppcVar6;
      GetCompiledSourceNinjaPath_abi_cxx11_(&sourceFilename,this,source);
      std::__cxx11::string::string((string *)&objectFilename,(string *)&escapedModuleObjectFilename)
      ;
      if (!singleOutput) {
        GetObjectFilePath(&commandLine,this,source,outputConfig);
        ConvertToNinjaPath(this,&commandLine);
        std::__cxx11::string::_M_assign((string *)&objectFilename);
        std::__cxx11::string::~string((string *)&commandLine);
      }
      pbVar2 = compileCmds.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      compileObjectVars.Objects = objectFilename._M_dataplus._M_p;
      for (s = compileCmds.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; s != pbVar2; s = s + 1) {
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (local_2b0,(cmOutputConverter *)this->LocalGenerator,s,&compileObjectVars);
      }
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      local_248._M_string_length = 0;
      local_248.field_2._M_local_buf[0] = '\0';
      cmLocalNinjaGenerator::BuildCommandLine
                (&commandLine,this->LocalGenerator,&compileCmds.Values,outputConfig,outputConfig,
                 &local_248,(cmGeneratorTarget *)0x0);
      std::__cxx11::string::~string((string *)&local_248);
      pcVar5 = GetGlobalGenerator(this);
      cmGlobalNinjaGenerator::AddCXXCompileCommand
                (pcVar5,&commandLine,&sourceFilename,&objectFilename);
      std::__cxx11::string::~string((string *)&commandLine);
      std::__cxx11::string::~string((string *)&objectFilename);
      std::__cxx11::string::~string((string *)&sourceFilename);
    }
    if (local_2b0 != (cmRulePlaceholderExpander *)0x0) {
      (*(local_2b0->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&compileCmds.Values);
    std::__cxx11::string::~string((string *)&escapedSourceFilenames);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&filenames);
    std::__cxx11::string::~string((string *)&escapedModuleObjectFilename);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::ExportSwiftObjectCompileCommand(
  std::vector<cmSourceFile const*> const& moduleSourceFiles,
  std::string const& moduleObjectFilename, std::string const& flags,
  std::string const& defines, std::string const& includes,
  std::string const& outputConfig, bool singleOutput)
{
  if (!this->GeneratorTarget->GetPropertyAsBool("EXPORT_COMPILE_COMMANDS")) {
    return;
  }

  auto escapeSourceFileName = [this](std::string srcFilename) -> std::string {
    if (!cmSystemTools::FileIsFullPath(srcFilename)) {
      srcFilename =
        cmSystemTools::CollapseFullPath(srcFilename,
                                        this->GetGlobalGenerator()
                                          ->GetCMakeInstance()
                                          ->GetHomeOutputDirectory());
    }

    return this->LocalGenerator->ConvertToOutputFormat(
      srcFilename, cmOutputConverter::SHELL);
  };
  auto escapedModuleObjectFilename =
    this->ConvertToNinjaPath(moduleObjectFilename);

  cmRulePlaceholderExpander::RuleVariables compileObjectVars;
  compileObjectVars.Language = "Swift";
  compileObjectVars.Flags = flags.c_str();
  compileObjectVars.Defines = defines.c_str();
  compileObjectVars.Includes = includes.c_str();

  // Build up the list of source files in the module
  std::vector<std::string> filenames;
  filenames.reserve(moduleSourceFiles.size());
  for (cmSourceFile const* sf : moduleSourceFiles) {
    filenames.emplace_back(
      escapeSourceFileName(this->GetCompiledSourceNinjaPath(sf)));
  }
  // Note that `escapedSourceFilenames` must remain alive until the
  // compileObjectVars is consumed or Source will be a dangling pointer.
  std::string const escapedSourceFilenames = cmJoin(filenames, " ");
  compileObjectVars.Source = escapedSourceFilenames.c_str();

  std::string const& compileCommand =
    this->Makefile->GetRequiredDefinition("CMAKE_Swift_COMPILE_OBJECT");
  cmList compileCmds(compileCommand);

  auto rulePlaceholderExpander =
    this->GetLocalGenerator()->CreateRulePlaceholderExpander();

  for (cmSourceFile const* sf : moduleSourceFiles) {
    std::string const sourceFilename = this->GetCompiledSourceNinjaPath(sf);
    std::string objectFilename = escapedModuleObjectFilename;

    if (!singleOutput) {
      // If it's not single-output, each source file gets a separate object
      objectFilename =
        this->ConvertToNinjaPath(this->GetObjectFilePath(sf, outputConfig));
    }
    compileObjectVars.Objects = objectFilename.c_str();

    for (std::string& cmd : compileCmds) {
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   cmd, compileObjectVars);
    }

    std::string commandLine = this->GetLocalGenerator()->BuildCommandLine(
      compileCmds, outputConfig, outputConfig);

    this->GetGlobalGenerator()->AddCXXCompileCommand(
      commandLine, sourceFilename, objectFilename);
  }
}